

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O1

int __thiscall NetworkAddress::serialise(NetworkAddress *this,uint8_t *buf,size_t max_len)

{
  uint uVar1;
  
  uVar1 = 0xffffffe1;
  if (1 < max_len) {
    *buf = (char)(this->super_BER_CONTAINER)._type;
    buf[1] = '\x04';
    uVar1 = 0xffffffe1;
    if (5 < max_len) {
      uVar1 = 2;
    }
  }
  if (-1 < (int)uVar1) {
    buf[uVar1] = (this->_value)._address.bytes[0];
    buf[(ulong)uVar1 + 1] = (this->_value)._address.bytes[1];
    buf[(ulong)uVar1 + 2] = (this->_value)._address.bytes[2];
    buf[(ulong)uVar1 + 3] = (this->_value)._address.bytes[3];
    uVar1 = uVar1 + 4;
  }
  return uVar1;
}

Assistant:

int NetworkAddress::serialise(uint8_t* buf, size_t max_len){
    int i = BER_CONTAINER::serialise(buf, max_len, 4);
    CHECK_ENCODE_ERR(i);
    uint8_t *ptr = buf + i;
    
    *ptr++ = _value[0];
    *ptr++ = _value[1];
    *ptr++ = _value[2];
    *ptr++ = _value[3];

    return ptr - buf;
}